

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polyedgecurve.cpp
# Opt level: O3

int __thiscall ON_PolyEdgeCurve::FindTrim(ON_PolyEdgeCurve *this,ON_BrepTrim *trim)

{
  int iVar1;
  ON_PolyEdgeSegment *pOVar2;
  int segment_index;
  
  if ((trim != (ON_BrepTrim *)0x0) &&
     (iVar1 = ON_PolyCurve::Count(&this->super_ON_PolyCurve), 0 < iVar1)) {
    segment_index = 0;
    do {
      pOVar2 = SegmentCurve(this,segment_index);
      if ((pOVar2 != (ON_PolyEdgeSegment *)0x0) && (pOVar2->m_trim == trim)) {
        return segment_index;
      }
      segment_index = segment_index + 1;
    } while (iVar1 != segment_index);
  }
  return -1;
}

Assistant:

int ON_PolyEdgeCurve::FindTrim( const ON_BrepTrim* trim) const
{
  int rc = -1;
  if ( 0 != trim )
  {
    int i, count = SegmentCount();
    for( i = 0; i < count; i++)
    {
      ON_PolyEdgeSegment* segment = SegmentCurve(i);
      if ( 0 != segment && trim == segment->BrepTrim() )
      {
        rc = i;
        break;
      }
    }
  }
  return rc;
}